

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SequenceRepeatLayerParams::Clear(SequenceRepeatLayerParams *this)

{
  uint32_t cached_has_bits;
  SequenceRepeatLayerParams *this_local;
  
  this->nrepetitions_ = 0;
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void SequenceRepeatLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.SequenceRepeatLayerParams)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  nrepetitions_ = uint64_t{0u};
  _internal_metadata_.Clear<std::string>();
}